

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void xdgSurfaceHandleConfigure(void *userData,xdg_surface *surface,uint32_t serial)

{
  PFN_wl_proxy_marshal_flags p_Var1;
  uint32_t uVar2;
  int iVar3;
  GLFWbool GVar4;
  int height;
  int iVar5;
  undefined1 auVar6 [16];
  float fVar8;
  undefined1 auVar7 [16];
  
  p_Var1 = _glfw.wl.client.proxy_marshal_flags;
  uVar2 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)surface);
  (*p_Var1)((wl_proxy *)surface,4,(wl_interface *)0x0,uVar2,0,(ulong)serial);
  iVar3 = *(int *)((long)userData + 0x3b0);
  if ((((*(int *)((long)userData + 0x370) != iVar3) &&
       (*(int *)((long)userData + 0x370) = iVar3, iVar3 == 0)) &&
      (*(long *)((long)userData + 0x50) != 0)) && (*(int *)((long)userData + 0x10) != 0)) {
    xdg_toplevel_set_minimized(*(xdg_toplevel **)((long)userData + 0x3c0));
  }
  iVar3 = *(int *)((long)userData + 0x36c);
  iVar5 = *(int *)((long)userData + 0x3a8);
  if (iVar3 != iVar5) {
    *(int *)((long)userData + 0x36c) = iVar5;
    _glfwInputWindowMaximize((_GLFWwindow *)userData,iVar5);
    iVar3 = *(int *)((long)userData + 0x36c);
  }
  *(int *)((long)userData + 0x374) = *(int *)((long)userData + 0x3b4);
  iVar5 = *(int *)((long)userData + 0x3a0);
  height = *(int *)((long)userData + 0x3a4);
  if (((iVar3 == 0 && *(int *)((long)userData + 0x3b4) == 0) &&
      (*(int *)((long)userData + 0x78) != -1)) && (*(int *)((long)userData + 0x7c) != -1)) {
    auVar7._4_4_ = (float)*(int *)((long)userData + 0x78);
    auVar7._0_4_ = (float)iVar5;
    auVar6._0_4_ = (float)height;
    auVar6._4_4_ = (float)*(int *)((long)userData + 0x7c);
    auVar6._8_8_ = 0;
    auVar7._8_8_ = 0;
    auVar7 = divps(auVar7,auVar6);
    fVar8 = auVar7._4_4_;
    if (fVar8 <= auVar7._0_4_) {
      if (fVar8 < auVar7._0_4_) {
        iVar5 = (int)(auVar6._0_4_ * fVar8);
      }
    }
    else {
      height = (int)((float)iVar5 / fVar8);
    }
  }
  GVar4 = resizeWindow((_GLFWwindow *)userData,iVar5,height);
  if (GVar4 != 0) {
    _glfwInputWindowSize
              ((_GLFWwindow *)userData,*(int *)((long)userData + 0x358),
               *(int *)((long)userData + 0x35c));
    if (*(int *)((long)userData + 0x368) != 0) {
      _glfwInputWindowDamage((_GLFWwindow *)userData);
    }
  }
  if ((*(int *)((long)userData + 0x368) == 0) &&
     ((*(long *)((long)userData + 0x3c8) == 0 || (*(int *)((long)userData + 0x3d0) != 0)))) {
    *(undefined4 *)((long)userData + 0x368) = 1;
    _glfwInputWindowDamage((_GLFWwindow *)userData);
    return;
  }
  return;
}

Assistant:

static void xdgSurfaceHandleConfigure(void* userData,
                                      struct xdg_surface* surface,
                                      uint32_t serial)
{
    _GLFWwindow* window = userData;

    xdg_surface_ack_configure(surface, serial);

    if (window->wl.activated != window->wl.pending.activated)
    {
        window->wl.activated = window->wl.pending.activated;
        if (!window->wl.activated)
        {
            if (window->monitor && window->autoIconify)
                xdg_toplevel_set_minimized(window->wl.xdg.toplevel);
        }
    }

    if (window->wl.maximized != window->wl.pending.maximized)
    {
        window->wl.maximized = window->wl.pending.maximized;
        _glfwInputWindowMaximize(window, window->wl.maximized);
    }

    window->wl.fullscreen = window->wl.pending.fullscreen;

    int width  = window->wl.pending.width;
    int height = window->wl.pending.height;

    if (!window->wl.maximized && !window->wl.fullscreen)
    {
        if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
        {
            const float aspectRatio = (float) width / (float) height;
            const float targetRatio = (float) window->numer / (float) window->denom;
            if (aspectRatio < targetRatio)
                height = width / targetRatio;
            else if (aspectRatio > targetRatio)
                width = height * targetRatio;
        }
    }

    if (resizeWindow(window, width, height))
    {
        _glfwInputWindowSize(window, window->wl.width, window->wl.height);

        if (window->wl.visible)
            _glfwInputWindowDamage(window);
    }

    if (!window->wl.visible)
    {
        // Allow the window to be mapped only if it either has no XDG
        // decorations or they have already received a configure event
        if (!window->wl.xdg.decoration || window->wl.xdg.decorationMode)
        {
            window->wl.visible = GLFW_TRUE;
            _glfwInputWindowDamage(window);
        }
    }
}